

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O1

void bc7enc_compress_block_init(void)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int c;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong in_RDX;
  long lVar7;
  uint32_t l;
  ulong uVar8;
  ulong in_RSI;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  
  lVar4 = 0;
  do {
    iVar9 = 0;
    lVar7 = 0;
    do {
      uVar8 = 0;
      uVar11 = 0xffff;
      do {
        uVar13 = 0;
        iVar16 = iVar9;
        do {
          iVar14 = ((uint)(((int)(uVar8 >> 5) + (int)uVar8 * 4 + (int)lVar7 * 2) * 0x2e + 0x20 +
                          ((int)(uVar13 >> 5) + iVar16) * 0x12) >> 6) - (int)lVar4;
          uVar15 = iVar14 * iVar14;
          uVar12 = uVar11 & 0xffff;
          uVar2 = in_RSI;
          uVar11 = uVar12;
          if (uVar15 < uVar12) {
            uVar2 = uVar8;
            uVar11 = uVar15;
          }
          in_RSI = uVar2 & 0xff;
          in_RDX = in_RDX & 0xff;
          if (uVar15 < uVar12) {
            in_RDX = uVar13;
          }
          uVar12 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar12;
          iVar16 = iVar16 + 4;
        } while (uVar12 != 0x40);
        uVar12 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar12;
      } while (uVar12 != 0x40);
      g_bc7_mode_1_optimal_endpoints[lVar4][lVar7].m_error = (uint16_t)uVar11;
      *(char *)(lVar4 * 8 + 0x169182 + lVar7 * 4) = (char)uVar2;
      *(char *)(lVar4 * 8 + 0x169183 + lVar7 * 4) = (char)in_RDX;
      iVar9 = iVar9 + 2;
      bVar17 = lVar7 == 0;
      lVar7 = lVar7 + 1;
    } while (bVar17);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  lVar4 = 0;
  do {
    iVar9 = 0;
    lVar7 = 0;
    do {
      lVar10 = 0;
      do {
        uVar12 = 0xffff;
        uVar8 = 0;
        uVar15 = 0;
        uVar11 = 0;
        do {
          uVar1 = (uint)uVar8;
          uVar5 = 0;
          iVar16 = iVar9;
          do {
            iVar14 = (((uVar5 >> 3) + iVar16) * 0x15 +
                      ((int)(uVar8 >> 3) + (int)lVar10 * 4 + uVar1 * 8) * 0x2b + 0x20 >> 6) -
                     (int)lVar4;
            uVar6 = iVar14 * iVar14;
            uVar12 = uVar12 & 0xffff;
            uVar3 = uVar15;
            uVar11 = uVar11 & 0xff;
            if (uVar6 < uVar12) {
              uVar3 = uVar1;
              uVar11 = uVar5;
            }
            uVar15 = uVar3 & 0xff;
            if (uVar6 < uVar12) {
              uVar12 = uVar6;
            }
            uVar5 = uVar5 + 1;
            iVar16 = iVar16 + 8;
          } while (uVar5 != 0x20);
          uVar8 = (ulong)(uVar1 + 1);
        } while (uVar1 + 1 != 0x20);
        g_bc7_mode_7_optimal_endpoints[lVar4][lVar7][lVar10].m_error = (uint16_t)uVar12;
        g_bc7_mode_7_optimal_endpoints[lVar4][lVar7][lVar10].m_lo = (uint8_t)uVar3;
        g_bc7_mode_7_optimal_endpoints[lVar4][lVar7][lVar10].m_hi = (uint8_t)uVar11;
        bVar17 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar17);
      iVar9 = iVar9 + 4;
      bVar17 = lVar7 == 0;
      lVar7 = lVar7 + 1;
    } while (bVar17);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  return;
}

Assistant:

void bc7enc_compress_block_init()
{
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t lp = 0; lp < 2; lp++)
		{
			endpoint_err best;
			best.m_error = (uint16_t)UINT16_MAX;
			for (uint32_t l = 0; l < 64; l++)
			{
				uint32_t low = ((l << 1) | lp) << 1;
				low |= (low >> 7);
				for (uint32_t h = 0; h < 64; h++)
				{
					uint32_t high = ((h << 1) | lp) << 1;
					high |= (high >> 7);
					const int k = (low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6;
					const int err = (k - c) * (k - c);
					if (err < best.m_error)
					{
						best.m_error = (uint16_t)err;
						best.m_lo = (uint8_t)l;
						best.m_hi = (uint8_t)h;
					}
				} // h
			} // l
			g_bc7_mode_1_optimal_endpoints[c][lp] = best;
		} // lp
	} // c

	// Mode 7: 555.1 2-bit indices 
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t hp = 0; hp < 2; hp++)
		{
			for (uint32_t lp = 0; lp < 2; lp++)
			{
				endpoint_err best;
				best.m_error = (uint16_t)UINT16_MAX;
				best.m_lo = 0;
				best.m_hi = 0;

				for (uint32_t l = 0; l < 32; l++)
				{
					uint32_t low = ((l << 1) | lp) << 2;
					low |= (low >> 6);

					for (uint32_t h = 0; h < 32; h++)
					{
						uint32_t high = ((h << 1) | hp) << 2;
						high |= (high >> 6);

						const int k = (low * (64 - g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX]) + high * g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX] + 32) >> 6;

						const int err = (k - c) * (k - c);
						if (err < best.m_error)
						{
							best.m_error = (uint16_t)err;
							best.m_lo = (uint8_t)l;
							best.m_hi = (uint8_t)h;
						}
					} // h
				} // l

				g_bc7_mode_7_optimal_endpoints[c][hp][lp] = best;

			} // hp

		} // lp

	} // c
}